

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitIfElseExpr(WasmBytecodeGenerator *this)

{
  uint32 uVar1;
  uint uVar2;
  uint label;
  WasmBinaryReader *pWVar3;
  BlockInfo *blockInfo;
  WasmCompilationException *this_00;
  PolymorphicEmitInfo PVar4;
  EmitInfo local_40;
  EmitInfo checkExpr;
  bool endOnElse;
  
  uVar2 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  local_40 = PopEvalStack(this,FirstLocalType,L"If expression must have type i32");
  ReleaseLocation(this,&local_40);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
            (this->m_writer,0x27,(ulong)uVar2,(ulong)local_40 & 0xffffffff);
  pWVar3 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar3 == (WasmBinaryReader *)0x0) {
    pWVar3 = (this->m_module->m_reader).ptr;
  }
  blockInfo = PushLabel(this,(pWVar3->super_WasmReaderBase).m_currentNode.field_1.block,label,true,
                        true);
  checkExpr.type._3_1_ = Void >> 0x18;
  EmitBlockCommon(this,blockInfo,(bool *)((long)&checkExpr.type + 3));
  EnsureYield(this,blockInfo);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)label,0x25);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar2);
  uVar1 = (blockInfo->yieldInfo).count;
  if (checkExpr.type._3_1_ == 1) {
    if (uVar1 != 0) {
      blockInfo->didYield = false;
    }
    EmitBlockCommon(this,blockInfo,(bool *)0x0);
    EnsureYield(this,blockInfo);
  }
  else if (uVar1 != 0) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Expected an else block when \'if\' returns a value");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar4 = PopLabel(this,label);
  return PVar4;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitIfElseExpr()
{
    Js::ByteCodeLabel falseLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel endLabel = m_writer->DefineLabel();

    EmitInfo checkExpr = PopEvalStack(WasmTypes::I32, _u("If expression must have type i32"));
    ReleaseLocation(&checkExpr);

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrFalse_Int, falseLabel, checkExpr.location);

    BlockInfo* blockInfo = PushLabel(GetReader()->m_currentNode.block, endLabel);
    bool endOnElse = false;
    EmitBlockCommon(blockInfo, &endOnElse);
    EnsureYield(blockInfo);

    m_writer->AsmBr(endLabel);
    m_writer->MarkAsmJsLabel(falseLabel);

    EmitInfo retInfo;
    EmitInfo falseExpr;
    if (endOnElse)
    {
        if (blockInfo->HasYield())
        {
            // Indicate that we need this block to yield a value
            blockInfo->didYield = false;
        }
        EmitBlockCommon(blockInfo);
        EnsureYield(blockInfo);
    }
    else if (blockInfo->HasYield())
    {
        throw WasmCompilationException(_u("Expected an else block when 'if' returns a value"));
    }
    m_writer->MarkAsmJsLabel(endLabel);

    return PopLabel(endLabel);
}